

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::PolygonOffsetTestCase::iterate(PolygonOffsetTestCase *this)

{
  ostringstream *this_00;
  Context *this_01;
  int iVar1;
  GLenum GVar2;
  MessageBuilder *this_02;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  NotSupportedError *pNVar4;
  GLenum expected;
  GLenum expected_00;
  GLenum expected_01;
  allocator<char> local_255;
  int local_254;
  GLuint colorRboId;
  GLuint fboId;
  GLuint depthRboId;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Testing PolygonOffset with ");
  this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_internalFormatName)
  ;
  std::operator<<(&(this_02->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " depth buffer.");
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (this->super_TestCase).m_context;
  if (this->m_internalFormat == 0) {
    pRVar3 = Context::getRenderTarget(this_01);
    iVar1 = pRVar3->m_width;
    pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_254 = this->m_targetSize;
    if ((iVar1 < local_254) || (pRVar3->m_height < local_254)) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fboId,"Render context size must be at least ",&local_255);
      de::toString<int>(&local_1f0,&local_254);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &depthRboId,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fboId,
                     &local_1f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &colorRboId,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &depthRboId,"x");
      de::toString<int>(&local_1d0,&local_254);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &colorRboId,&local_1d0);
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar3->m_depthBits == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"polygon offset tests require depth buffer",
                 (allocator<char> *)&colorRboId);
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  }
  else {
    iVar1 = (*this_01->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar1);
    colorRboId = 0;
    depthRboId = 0;
    fboId = 0;
    (*gl->genRenderbuffers)(1,&colorRboId);
    (*gl->bindRenderbuffer)(0x8d41,colorRboId);
    (*gl->renderbufferStorage)(0x8d41,0x8056,this->m_targetSize,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,gl,expected);
    (*gl->genRenderbuffers)(1,&depthRboId);
    (*gl->bindRenderbuffer)(0x8d41,depthRboId);
    (*gl->renderbufferStorage)(0x8d41,this->m_internalFormat,this->m_targetSize,this->m_targetSize);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,gl,expected_00);
    (*gl->genFramebuffers)(1,&fboId);
    (*gl->bindFramebuffer)(0x8d40,fboId);
    (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorRboId);
    (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,depthRboId);
    verifyError((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,gl,expected_01);
    GVar2 = (*gl->checkFramebufferStatus)(0x8d40);
    if (GVar2 != 0x8cd5) {
      (*gl->deleteFramebuffers)(1,&fboId);
      (*gl->deleteRenderbuffers)(1,&depthRboId);
      (*gl->deleteRenderbuffers)(1,&colorRboId);
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"could not create fbo for testing.",
                 (allocator<char> *)&local_1f0);
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    (*gl->deleteFramebuffers)(1,&fboId);
    (*gl->deleteRenderbuffers)(1,&depthRboId);
    (*gl->deleteRenderbuffers)(1,&colorRboId);
  }
  return STOP;
}

Assistant:

PolygonOffsetTestCase::IterateResult PolygonOffsetTestCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog() << tcu::TestLog::Message << "Testing PolygonOffset with " << m_internalFormatName << " depth buffer." << tcu::TestLog::EndMessage;

	if (m_internalFormat == 0)
	{
		// default framebuffer
		const int width		= m_context.getRenderTarget().getWidth();
		const int height	= m_context.getRenderTarget().getHeight();

		checkCanvasSize(width, height, m_targetSize, m_targetSize);

		if (m_context.getRenderTarget().getDepthBits() == 0)
			throw tcu::NotSupportedError("polygon offset tests require depth buffer");

		testPolygonOffset();
	}
	else
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// framebuffer object
		GLuint	colorRboId	= 0;
		GLuint	depthRboId	= 0;
		GLuint	fboId		= 0;
		bool	fboComplete;

		gl.genRenderbuffers(1, &colorRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, colorRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genRenderbuffers(1, &depthRboId);
		gl.bindRenderbuffer(GL_RENDERBUFFER, depthRboId);
		gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, m_targetSize, m_targetSize);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		gl.genFramebuffers(1, &fboId);
		gl.bindFramebuffer(GL_FRAMEBUFFER, fboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRboId);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,	GL_RENDERBUFFER, depthRboId);
		verifyError(m_testCtx, gl, GL_NO_ERROR);

		fboComplete = gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE;

		if (fboComplete)
			testPolygonOffset();

		gl.deleteFramebuffers(1, &fboId);
		gl.deleteRenderbuffers(1, &depthRboId);
		gl.deleteRenderbuffers(1, &colorRboId);

		if (!fboComplete)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}

	return STOP;
}